

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_sys.c
# Opt level: O2

c_int init_linsys_solver(LinSysSolver **s,csc *P,csc *A,c_float sigma,c_float *rho_vec,
                        linsys_solver_type linsys_solver,c_int polish)

{
  c_int cVar1;
  
  if (linsys_solver != MKL_PARDISO_SOLVER) {
    cVar1 = init_linsys_solver_qdldl((qdldl_solver **)s,P,A,sigma,rho_vec,polish);
    return cVar1;
  }
  cVar1 = init_linsys_solver_pardiso((pardiso_solver **)s,P,A,sigma,rho_vec,polish);
  return cVar1;
}

Assistant:

c_int init_linsys_solver(LinSysSolver          **s,
                         const csc              *P,
                         const csc              *A,
                         c_float                 sigma,
                         const c_float          *rho_vec,
                         enum linsys_solver_type linsys_solver,
                         c_int                   polish) {
  switch (linsys_solver) {
  case QDLDL_SOLVER:
    return init_linsys_solver_qdldl((qdldl_solver **)s, P, A, sigma, rho_vec, polish);

# ifdef ENABLE_MKL_PARDISO
  case MKL_PARDISO_SOLVER:
    return init_linsys_solver_pardiso((pardiso_solver **)s, P, A, sigma, rho_vec, polish);

# endif /* ifdef ENABLE_MKL_PARDISO */
  default: // QDLDL
    return init_linsys_solver_qdldl((qdldl_solver **)s, P, A, sigma, rho_vec, polish);
  }
}